

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O3

void __thiscall QGraphicsLinearLayout::~QGraphicsLinearLayout(QGraphicsLinearLayout *this)

{
  bool bVar1;
  int iVar2;
  QGraphicsLayoutItem *this_00;
  uint uVar3;
  undefined4 extraout_var;
  
  (this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem =
       (_func_int **)&PTR__QGraphicsLinearLayout_00813110;
  iVar2 = QGridLayoutEngine::itemCount();
  if (0 < iVar2) {
    uVar3 = iVar2 + 1;
    do {
      iVar2 = (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem
                [10])(this,(ulong)(uVar3 - 2));
      this_00 = (QGraphicsLayoutItem *)CONCAT44(extraout_var,iVar2);
      (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[0xb])
                (this);
      if (this_00 != (QGraphicsLayoutItem *)0x0) {
        QGraphicsLayoutItem::setParentLayoutItem(this_00,(QGraphicsLayoutItem *)0x0);
        bVar1 = QGraphicsLayoutItem::ownedByLayout(this_00);
        if (bVar1) {
          (*this_00->_vptr_QGraphicsLayoutItem[1])(this_00);
        }
      }
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  QGraphicsLayout::~QGraphicsLayout(&this->super_QGraphicsLayout);
  return;
}

Assistant:

QGraphicsLinearLayout::~QGraphicsLinearLayout()
{
    for (int i = count() - 1; i >= 0; --i) {
        QGraphicsLayoutItem *item = itemAt(i);
        // The following lines can be removed, but this removes the item
        // from the layout more efficiently than the implementation of
        // ~QGraphicsLayoutItem.
        removeAt(i);
        if (item) {
            item->setParentLayoutItem(nullptr);
            if (item->ownedByLayout())
                delete item;
        }
    }
}